

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O0

bool google::InitVLOG3__(SiteFlag *site_flag,int32 *level_default,char *fname,int32 verbose_level)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  int *piVar4;
  char *pcVar5;
  size_t patt_len;
  VModuleInfo *local_80;
  char *local_78;
  long local_70;
  VModuleInfo *info;
  size_t base_length;
  char *base_end;
  char *base;
  int32 *site_flag_value;
  int old_errno;
  bool read_vmodule_flag;
  lock_guard<std::mutex> l;
  int32 verbose_level_local;
  char *fname_local;
  int32 *level_default_local;
  SiteFlag *site_flag_local;
  
  l._M_device._4_4_ = verbose_level;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd0,(mutex_type *)vmodule_mutex);
  bVar2 = inited_vmodule & 1;
  if (bVar2 == 0) {
    VLOG2Initializer();
  }
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  pcVar5 = strrchr(fname,0x2f);
  local_78 = fname;
  if (pcVar5 != (char *)0x0) {
    local_78 = pcVar5 + 1;
  }
  pcVar5 = strchr(local_78,0x2e);
  if (pcVar5 == (char *)0x0) {
    local_80 = (VModuleInfo *)strlen(local_78);
  }
  else {
    local_80 = (VModuleInfo *)(pcVar5 + -(long)local_78);
  }
  info = local_80;
  if (((VModuleInfo *)0x3 < local_80) && (*(int *)(local_78 + (long)local_80 + -4) == 0x6c6e692d)) {
    info = (VModuleInfo *)((long)&local_80[-1].next + 4);
  }
  local_70 = vmodule_list;
  do {
    base = (char *)level_default;
    if (local_70 == 0) {
LAB_0014d975:
      if (((bVar2 != 0) && (site_flag->level = (int32 *)base, (int32 *)base == level_default)) &&
         (site_flag->base_name == (char *)0x0)) {
        site_flag->base_name = local_78;
        site_flag->base_len = (size_t)info;
        site_flag->next = cached_site_list;
        cached_site_list = site_flag;
      }
      piVar4 = __errno_location();
      *piVar4 = iVar1;
      bVar3 = l._M_device._4_4_ <= *(int *)base;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd0);
      return bVar3;
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    patt_len = std::__cxx11::string::size();
    bVar3 = glog_internal_namespace_::SafeFNMatch_(pcVar5,patt_len,local_78,(size_t)info);
    if (bVar3) {
      base = (char *)(local_70 + 0x20);
      goto LAB_0014d975;
    }
    local_70 = *(long *)(local_70 + 0x28);
  } while( true );
}

Assistant:

bool InitVLOG3__(SiteFlag* site_flag, int32* level_default, const char* fname,
                 int32 verbose_level) {
  std::lock_guard<std::mutex> l(vmodule_mutex);
  bool read_vmodule_flag = inited_vmodule;
  if (!read_vmodule_flag) {
    VLOG2Initializer();
  }

  // protect the errno global in case someone writes:
  // VLOG(..) << "The last error was " << strerror(errno)
  int old_errno = errno;

  // site_default normally points to FLAGS_v
  int32* site_flag_value = level_default;

  // Get basename for file
  const char* base = strrchr(fname, '/');

#ifdef _WIN32
  if (!base) {
    base = strrchr(fname, '\\');
  }
#endif

  base = base ? (base + 1) : fname;
  const char* base_end = strchr(base, '.');
  size_t base_length =
      base_end ? static_cast<size_t>(base_end - base) : strlen(base);

  // Trim out trailing "-inl" if any
  if (base_length >= 4 && (memcmp(base + base_length - 4, "-inl", 4) == 0)) {
    base_length -= 4;
  }

  // TODO: Trim out _unittest suffix?  Perhaps it is better to have
  // the extra control and just leave it there.

  // find target in vector of modules, replace site_flag_value with
  // a module-specific verbose level, if any.
  for (const VModuleInfo* info = vmodule_list; info != nullptr;
       info = info->next) {
    if (SafeFNMatch_(info->module_pattern.c_str(), info->module_pattern.size(),
                     base, base_length)) {
      site_flag_value = &info->vlog_level;
      // value at info->vlog_level is now what controls
      // the VLOG at the caller site forever
      break;
    }
  }

  // Cache the vlog value pointer if --vmodule flag has been parsed.
  ANNOTATE_BENIGN_RACE(site_flag,
                       "*site_flag may be written by several threads,"
                       " but the value will be the same");
  if (read_vmodule_flag) {
    site_flag->level = site_flag_value;
    // If VLOG flag has been cached to the default site pointer,
    // we want to add to the cached list in order to invalidate in case
    // SetVModule is called afterwards with new modules.
    // The performance penalty here is neglible, because InitVLOG3__ is called
    // once per site.
    if (site_flag_value == level_default && !site_flag->base_name) {
      site_flag->base_name = base;
      site_flag->base_len = base_length;
      site_flag->next = cached_site_list;
      cached_site_list = site_flag;
    }
  }

  // restore the errno in case something recoverable went wrong during
  // the initialization of the VLOG mechanism (see above note "protect the..")
  errno = old_errno;
  return *site_flag_value >= verbose_level;
}